

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_sparse.hpp
# Opt level: O2

unsigned_long *
boost::numeric::ublas::detail::lower_bound<unsigned_long*,unsigned_long,std::less<unsigned_long>>
          (long *begin,long *end,ulong *t)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  unsigned_long *puVar4;
  
  puVar1 = (ulong *)*begin;
  puVar2 = (ulong *)*end;
  puVar3 = puVar1;
  if (((puVar1 != puVar2) && (*puVar1 < *t)) && (puVar3 = puVar2, *t <= puVar2[-1])) {
    puVar4 = std::
             __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_comp_val<std::less<unsigned_long>>>
                       (puVar1);
    return puVar4;
  }
  return puVar3;
}

Assistant:

BOOST_UBLAS_INLINE
        I lower_bound (const I &begin, const I &end, const T &t, C compare) {
            // t <= *begin <=> ! (*begin < t)
            if (begin == end || ! compare (*begin, t))
                return begin;
            if (compare (*(end - 1), t))
                return end;
            return std::lower_bound (begin, end, t, compare);
        }